

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::anon_unknown_2::ActiveTextureTestCase::test(ActiveTextureTestCase *this)

{
  CallLogWrapper *this_00;
  int iVar1;
  GLint textureUnits;
  GLint local_2c;
  
  (*this->m_verifier->_vptr_StateVerifier[2])
            (this->m_verifier,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0x84e0,
             0x84c0);
  iVar1 = 0;
  ApiCase::expectError(&this->super_ApiCase,0);
  local_2c = 0;
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegerv(this_00,0x8b4d,&local_2c);
  ApiCase::expectError(&this->super_ApiCase,0);
  if (0 < local_2c) {
    do {
      glu::CallLogWrapper::glActiveTexture(this_00,iVar1 + 0x84c0U);
      ApiCase::expectError(&this->super_ApiCase,0);
      (*this->m_verifier->_vptr_StateVerifier[2])
                (this->m_verifier,
                 (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0x84e0
                 ,(ulong)(iVar1 + 0x84c0U));
      ApiCase::expectError(&this->super_ApiCase,0);
      iVar1 = iVar1 + 1;
    } while (iVar1 < local_2c);
  }
  return;
}

Assistant:

void test (void)
	{
		m_verifier->verifyInteger(m_testCtx, GL_ACTIVE_TEXTURE, GL_TEXTURE0);
		expectError(GL_NO_ERROR);

		GLint textureUnits = 0;
		glGetIntegerv(GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS, &textureUnits);
		expectError(GL_NO_ERROR);

		for (int ndx = 0; ndx < textureUnits; ++ndx)
		{
			glActiveTexture(GL_TEXTURE0 + ndx);
			expectError(GL_NO_ERROR);

			m_verifier->verifyInteger(m_testCtx, GL_ACTIVE_TEXTURE, GL_TEXTURE0 + ndx);
			expectError(GL_NO_ERROR);
		}
	}